

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O2

void __thiscall mathOps_hypot_Test::TestBody(mathOps_hypot_Test *this)

{
  char *pcVar1;
  AssertHelper local_70;
  AssertionResult gtest_ar_2;
  measurement res2;
  AssertHelper local_48;
  measurement res;
  measurement m2;
  measurement m1;
  
  m1.value_ = 5.0;
  m1.units_.multiplier_ = 1.0;
  m1.units_.base_units_ = (unit_data)0x1;
  m2.value_ = 5.4;
  m2.units_.multiplier_ = 0.0254;
  m2.units_.base_units_ = (unit_data)0x1;
  res = units::hypot<units::measurement,units::measurement,void>(&m1,&m2);
  testing::internal::CmpHelperGT<units::measurement,units::measurement>
            ((internal *)&res2,"res","m1",&res,&m1);
  if (res2.value_._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (res2.units_ == (unit)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)res2.units_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xac,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&res2.units_);
  testing::internal::CmpHelperGT<units::measurement,units::measurement>
            ((internal *)&res2,"res","m2",&res,&m2);
  if (res2.value_._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (res2.units_ == (unit)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)res2.units_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xad,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&res2.units_);
  res2 = units::hypot<units::measurement,units::measurement,void>(&m2,&m1);
  testing::internal::CmpHelperEQ<units::measurement,units::measurement>
            ((internal *)&gtest_ar_2,"res","res2",&res,&res2);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xb0,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_70.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_70.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  return;
}

Assistant:

TEST(mathOps, hypot)
{
    measurement m1(5.0, m);
    measurement m2(5.4, in);

    auto res = hypot(m1, m2);
    EXPECT_GT(res, m1);
    EXPECT_GT(res, m2);

    auto res2 = hypot(m2, m1);
    EXPECT_EQ(res, res2);
}